

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O3

void lua_close(lua_State *L)

{
  MSize *pMVar1;
  int iVar2;
  TValue *pTVar3;
  global_State *g;
  uint uVar4;
  lua_State *L_00;
  
  g = (global_State *)(ulong)(L->glref).ptr32;
  L_00 = (lua_State *)(ulong)(g->mainthref).gcptr32;
  lj_func_closeuv(L_00,(TValue *)(ulong)(L_00->stack).ptr32);
  lj_gc_separateudata(g,1);
  pMVar1 = &g[1].strempty.hash;
  *(byte *)pMVar1 = (byte)*pMVar1 & 0xfe;
  g[1].uvhead.field_5.field_1.next.gcptr32 = 0;
  lj_dispatch_update(g);
  uVar4 = 0;
  do {
    do {
      g->hookmask = g->hookmask | 0x10;
      L_00->status = '\0';
      L_00->cframe = (void *)0x0;
      pTVar3 = (TValue *)((ulong)(L_00->stack).ptr32 + 8);
      L_00->top = pTVar3;
      L_00->base = pTVar3;
      iVar2 = lj_vm_cpcall(L_00,0,0,cpfinalize);
    } while (iVar2 != 0);
    if (8 < uVar4) break;
    uVar4 = uVar4 + 1;
    lj_gc_separateudata(g,1);
  } while ((g->gc).mmudata.gcptr32 != 0);
  close_state(L_00);
  return;
}

Assistant:

LUA_API void lua_close(lua_State *L)
{
  global_State *g = G(L);
  int i;
  L = mainthread(g);  /* Only the main thread can be closed. */
  lj_func_closeuv(L, tvref(L->stack));
  lj_gc_separateudata(g, 1);  /* Separate udata which have GC metamethods. */
#if LJ_HASJIT
  G2J(g)->flags &= ~JIT_F_ON;
  G2J(g)->state = LJ_TRACE_IDLE;
  lj_dispatch_update(g);
#endif
  for (i = 0;;) {
    hook_enter(g);
    L->status = 0;
    L->cframe = NULL;
    L->base = L->top = tvref(L->stack) + 1;
    if (lj_vm_cpcall(L, NULL, NULL, cpfinalize) == 0) {
      if (++i >= 10) break;
      lj_gc_separateudata(g, 1);  /* Separate udata again. */
      if (gcref(g->gc.mmudata) == NULL)  /* Until nothing is left to do. */
	break;
    }
  }
  close_state(L);
}